

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# coded_stream.h
# Opt level: O2

void __thiscall
google::protobuf::io::CodedOutputStream::WriteVarint32(CodedOutputStream *this,uint32 value)

{
  uint8 *target;
  int iVar1;
  uint8 *puVar2;
  
  if (4 < this->buffer_size_) {
    target = this->buffer_;
    puVar2 = WriteVarint32ToArray(value,target);
    iVar1 = (int)puVar2 - (int)target;
    this->buffer_ = this->buffer_ + iVar1;
    this->buffer_size_ = this->buffer_size_ - iVar1;
    return;
  }
  WriteVarint32SlowPath(this,value);
  return;
}

Assistant:

inline void CodedOutputStream::WriteVarint32(uint32 value) {
  if (buffer_size_ >= 5) {
    // Fast path:  We have enough bytes left in the buffer to guarantee that
    // this write won't cross the end, so we can skip the checks.
    uint8* target = buffer_;
    uint8* end = WriteVarint32ToArray(value, target);
    int size = static_cast<int>(end - target);
    Advance(size);
  } else {
    WriteVarint32SlowPath(value);
  }
}